

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O3

size_t ans_fold_compress<5u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  long *plVar1;
  uint8_t *puVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  array<unsigned_long,_4UL> states;
  ans_fold_encode<5U> ans_frame;
  long *local_a8;
  uint64_t local_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  size_t local_80;
  uint8_t *local_78;
  ans_fold_encode<5U> local_70;
  
  ans_fold_encode<5U>::create(&local_70,src,srcSize);
  local_a8 = (long *)dst;
  ans_serialize_interp(&local_70.nfreqs,local_70.frame_size,(uint8_t **)&local_a8);
  local_a0 = local_70.lower_bound;
  uStack_98 = local_70.lower_bound;
  uStack_90 = local_70.lower_bound;
  uStack_88 = local_70.lower_bound;
  local_78 = dst;
  if ((srcSize & 3) == 0) {
    sVar3 = 0;
  }
  else {
    uVar5 = (ulong)((uint)srcSize & 3);
    lVar4 = 0;
    local_80 = uVar5;
    do {
      ans_fold_encode<5U>::encode_symbol
                (&local_70,&local_a0,src[srcSize + lVar4 + -1],(uint8_t **)&local_a8);
      lVar4 = lVar4 + -1;
      sVar3 = local_80;
    } while (-lVar4 != uVar5);
  }
  if (sVar3 != srcSize) {
    uVar5 = srcSize & 0xfffffffffffffffc;
    do {
      ans_fold_encode<5U>::encode_symbol(&local_70,&local_a0,src[uVar5 - 1],(uint8_t **)&local_a8);
      ans_fold_encode<5U>::encode_symbol(&local_70,&uStack_98,src[uVar5 - 2],(uint8_t **)&local_a8);
      ans_fold_encode<5U>::encode_symbol(&local_70,&uStack_90,src[uVar5 - 3],(uint8_t **)&local_a8);
      ans_fold_encode<5U>::encode_symbol(&local_70,&uStack_88,src[uVar5 - 4],(uint8_t **)&local_a8);
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
  }
  plVar1 = local_a8;
  *local_a8 = local_a0 - local_70.lower_bound;
  local_a8[1] = uStack_98 - local_70.lower_bound;
  local_a8[2] = uStack_90 - local_70.lower_bound;
  local_a8[3] = uStack_88 - local_70.lower_bound;
  if (local_70.table.super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.table.
                    super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.table.
                          super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.table.
                          super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = local_78;
  if (local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)plVar1 + (0x20 - (long)puVar2);
}

Assistant:

size_t ans_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding, we encode 4 states at the same time for speed
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}